

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::UnicodeString::doReverse(UnicodeString *this,int32_t start,int32_t length)

{
  char16_t cVar1;
  char16_t cVar2;
  UChar UVar3;
  byte bVar4;
  UBool UVar5;
  char16_t *pcVar6;
  char16_t *pcVar7;
  UChar *pUVar8;
  UChar swap2;
  UBool hasSupplementary;
  char16_t *pcStack_30;
  UChar swap;
  UChar *right;
  UChar *left;
  int32_t length_local;
  int32_t start_local;
  UnicodeString *this_local;
  
  if (((1 < length) &&
      (left._0_4_ = length, left._4_4_ = start, _length_local = this,
      UVar5 = cloneArrayIfNeeded(this,-1,-1,'\x01',(int32_t **)0x0,'\0'), UVar5 != '\0')) &&
     (pinIndices(this,(int32_t *)((long)&left + 4),(int32_t *)&left), 1 < (int32_t)left)) {
    pcVar6 = getArrayStart(this);
    bVar4 = 0;
    pcStack_30 = pcVar6 + left._4_4_ + (long)(int32_t)left + -1;
    right = pcVar6 + left._4_4_;
    do {
      cVar1 = *right;
      cVar2 = *pcStack_30;
      pcVar6 = right + 1;
      *right = cVar2;
      bVar4 = bVar4 | (cVar1 & 0xfc00U) == 0xd800U | (cVar2 & 0xfc00U) == 0xd800U;
      pcVar7 = pcStack_30 + -1;
      *pcStack_30 = cVar1;
      pcStack_30 = pcVar7;
      right = pcVar6;
    } while (pcVar6 < pcVar7);
    if ((bool)(bVar4 | (*pcVar6 & 0xfc00U) == 0xd800U)) {
      pcVar6 = getArrayStart(this);
      right = pcVar6 + left._4_4_;
      pcVar6 = right + (long)(int32_t)left + -1;
      while (right < pcVar6) {
        UVar3 = *right;
        if (((UVar3 & 0xfc00U) == 0xdc00) && ((right[1] & 0xfc00U) == 0xd800)) {
          pUVar8 = right + 1;
          *right = right[1];
          right = right + 2;
          *pUVar8 = UVar3;
        }
        else {
          right = right + 1;
        }
      }
    }
  }
  return this;
}

Assistant:

UnicodeString&
UnicodeString::doReverse(int32_t start, int32_t length) {
  if(length <= 1 || !cloneArrayIfNeeded()) {
    return *this;
  }

  // pin the indices to legal values
  pinIndices(start, length);
  if(length <= 1) {  // pinIndices() might have shrunk the length
    return *this;
  }

  UChar *left = getArrayStart() + start;
  UChar *right = left + length - 1;  // -1 for inclusive boundary (length>=2)
  UChar swap;
  UBool hasSupplementary = FALSE;

  // Before the loop we know left<right because length>=2.
  do {
    hasSupplementary |= (UBool)U16_IS_LEAD(swap = *left);
    hasSupplementary |= (UBool)U16_IS_LEAD(*left++ = *right);
    *right-- = swap;
  } while(left < right);
  // Make sure to test the middle code unit of an odd-length string.
  // Redundant if the length is even.
  hasSupplementary |= (UBool)U16_IS_LEAD(*left);

  /* if there are supplementary code points in the reversed range, then re-swap their surrogates */
  if(hasSupplementary) {
    UChar swap2;

    left = getArrayStart() + start;
    right = left + length - 1; // -1 so that we can look at *(left+1) if left<right
    while(left < right) {
      if(U16_IS_TRAIL(swap = *left) && U16_IS_LEAD(swap2 = *(left + 1))) {
        *left++ = swap2;
        *left++ = swap;
      } else {
        ++left;
      }
    }
  }

  return *this;
}